

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

void __thiscall
PolygonTriangulation::compute_offset_vertex
          (PolygonTriangulation *this,uint32_t max_y_index,uint32_t min_y_index,vertex_t *offset)

{
  vertex_t *pvVar1;
  vertex_t *pvVar2;
  double dVar3;
  double invlen;
  vertex_t *B;
  vertex_t *A;
  double eps;
  vertex_t *offset_local;
  uint32_t min_y_index_local;
  uint32_t max_y_index_local;
  PolygonTriangulation *this_local;
  
  pvVar2 = this->vertices_ + max_y_index;
  pvVar1 = this->vertices_;
  offset->x = pvVar1[min_y_index].x - pvVar2->x;
  offset->y = pvVar1[min_y_index].y - pvVar2->y;
  dVar3 = sqrt(offset->x * offset->x + offset->y * offset->y);
  offset->x = (1.0 / dVar3) * 0.001 * offset->x;
  offset->y = (1.0 / dVar3) * 0.001 * offset->y;
  offset->x = pvVar2->x + offset->x;
  offset->y = pvVar2->y + offset->y;
  return;
}

Assistant:

void PolygonTriangulation::compute_offset_vertex(
    const uint32_t max_y_index,
    const uint32_t min_y_index,
    vertex_t &offset
) const {
  const auto eps = 1.0e-3;

  const auto &A = vertices_[max_y_index];
  const auto &B = vertices_[min_y_index];
  offset.x = B.x - A.x;
  offset.y = B.y - A.y;
  const auto invlen = 1.0 / sqrt(offset.x*offset.x + offset.y*offset.y);
  offset.x *= invlen * eps;
  offset.y *= invlen * eps;

  offset.x = A.x + offset.x;
  offset.y = A.y + offset.y;
}